

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O1

void base64_stream_encode_avx2(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  undefined1 auVar2 [32];
  undefined1 *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [32];
  long lVar11;
  undefined1 (*pauVar12) [32];
  byte bVar13;
  uint uVar14;
  long lVar15;
  size_t sVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  size_t local_50;
  
  uVar14 = state->bytes;
  sVar16 = (size_t)uVar14;
  local_50 = 0;
  bVar13 = state->carry;
  if (sVar16 == 2) goto LAB_001073a7;
  if (uVar14 == 1) goto LAB_00107366;
  if (uVar14 == 0) {
    do {
      local_50 = sVar16;
      if (0x1f < srclen) {
        uVar5 = (srclen - 4) / 0x18;
        srclen = srclen + uVar5 * -0x18;
        auVar21 = vpermq_avx2(*(undefined1 (*) [32])src,0x94);
        auVar24 = vpshufb_avx2(auVar21,_DAT_0010c0e0);
        auVar21 = vpand_avx2(auVar24,_DAT_0010c100);
        auVar25 = vpmulhuw_avx2(auVar21,_DAT_0010c120);
        auVar21 = vpand_avx2(auVar24,_DAT_0010c140);
        auVar24 = vpsllw_avx2(auVar21,8);
        auVar21 = vpsllw_avx2(auVar21,4);
        auVar21 = vpblendw_avx2(auVar21,auVar24,0xaa);
        auVar25 = vpor_avx2(auVar21,auVar25);
        auVar22[8] = 0x33;
        auVar22._0_8_ = 0x3333333333333333;
        auVar22[9] = 0x33;
        auVar22[10] = 0x33;
        auVar22[0xb] = 0x33;
        auVar22[0xc] = 0x33;
        auVar22[0xd] = 0x33;
        auVar22[0xe] = 0x33;
        auVar22[0xf] = 0x33;
        auVar22[0x10] = 0x33;
        auVar22[0x11] = 0x33;
        auVar22[0x12] = 0x33;
        auVar22[0x13] = 0x33;
        auVar22[0x14] = 0x33;
        auVar22[0x15] = 0x33;
        auVar22[0x16] = 0x33;
        auVar22[0x17] = 0x33;
        auVar22[0x18] = 0x33;
        auVar22[0x19] = 0x33;
        auVar22[0x1a] = 0x33;
        auVar22[0x1b] = 0x33;
        auVar22[0x1c] = 0x33;
        auVar22[0x1d] = 0x33;
        auVar22[0x1e] = 0x33;
        auVar22[0x1f] = 0x33;
        auVar24 = vpsubusb_avx2(auVar25,auVar22);
        auVar23[8] = 0x19;
        auVar23._0_8_ = 0x1919191919191919;
        auVar23[9] = 0x19;
        auVar23[10] = 0x19;
        auVar23[0xb] = 0x19;
        auVar23[0xc] = 0x19;
        auVar23[0xd] = 0x19;
        auVar23[0xe] = 0x19;
        auVar23[0xf] = 0x19;
        auVar23[0x10] = 0x19;
        auVar23[0x11] = 0x19;
        auVar23[0x12] = 0x19;
        auVar23[0x13] = 0x19;
        auVar23[0x14] = 0x19;
        auVar23[0x15] = 0x19;
        auVar23[0x16] = 0x19;
        auVar23[0x17] = 0x19;
        auVar23[0x18] = 0x19;
        auVar23[0x19] = 0x19;
        auVar23[0x1a] = 0x19;
        auVar23[0x1b] = 0x19;
        auVar23[0x1c] = 0x19;
        auVar23[0x1d] = 0x19;
        auVar23[0x1e] = 0x19;
        auVar23[0x1f] = 0x19;
        auVar21 = vpcmpgtb_avx2(auVar25,auVar23);
        auVar21 = vpsubb_avx2(auVar24,auVar21);
        auVar24._16_16_ = _DAT_0010bfd0;
        auVar24._0_16_ = _DAT_0010bfd0;
        auVar21 = vpshufb_avx2(auVar24,auVar21);
        auVar21 = vpaddb_avx2(auVar21,auVar25);
        *(undefined1 (*) [32])out = auVar21;
        auVar21 = _DAT_0010c180;
        pauVar10 = (undefined1 (*) [32])(*(undefined1 (*) [32])src + 0x14);
        out = (char *)((long)out + 0x20);
        uVar6 = uVar5 - 1;
        if (uVar6 != 0) {
          auVar25._8_4_ = 0xfc0fc00;
          auVar25._0_8_ = 0xfc0fc000fc0fc00;
          auVar25._12_4_ = 0xfc0fc00;
          auVar25._16_4_ = 0xfc0fc00;
          auVar25._20_4_ = 0xfc0fc00;
          auVar25._24_4_ = 0xfc0fc00;
          auVar25._28_4_ = 0xfc0fc00;
          auVar26._8_4_ = 0x4000040;
          auVar26._0_8_ = 0x400004004000040;
          auVar26._12_4_ = 0x4000040;
          auVar26._16_4_ = 0x4000040;
          auVar26._20_4_ = 0x4000040;
          auVar26._24_4_ = 0x4000040;
          auVar26._28_4_ = 0x4000040;
          auVar27._8_4_ = 0x3f03f0;
          auVar27._0_8_ = 0x3f03f0003f03f0;
          auVar27._12_4_ = 0x3f03f0;
          auVar27._16_4_ = 0x3f03f0;
          auVar27._20_4_ = 0x3f03f0;
          auVar27._24_4_ = 0x3f03f0;
          auVar27._28_4_ = 0x3f03f0;
          do {
            if (uVar6 < 8) {
              if (3 < uVar6) {
                lVar15 = -4;
                lVar7 = 0x80;
                lVar19 = 0x60;
                lVar20 = 0x48;
                lVar17 = 0x40;
                lVar8 = 0x30;
                lVar4 = 0x20;
                lVar11 = 0x18;
                lVar18 = 0x60;
                pauVar9 = (undefined1 (*) [32])out;
                pauVar12 = pauVar10;
                goto LAB_0010716b;
              }
              if (uVar6 == 1) {
                auVar26 = vpshufb_avx2(*pauVar10,_DAT_0010c180);
                auVar21 = vpand_avx2(auVar26,_DAT_0010c100);
                auVar25 = vpmulhuw_avx2(auVar21,_DAT_0010c120);
                auVar21 = vpand_avx2(auVar26,_DAT_0010c140);
                auVar26 = vpsllw_avx2(auVar21,8);
                auVar21 = vpsllw_avx2(auVar21,4);
                auVar21 = vpblendw_avx2(auVar21,auVar26,0xaa);
                auVar25 = vpor_avx2(auVar21,auVar25);
                auVar22 = vpsubusb_avx2(auVar25,auVar22);
                auVar21 = vpcmpgtb_avx2(auVar25,auVar23);
                auVar21 = vpsubb_avx2(auVar22,auVar21);
                auVar21 = vpshufb_avx2(auVar24,auVar21);
                auVar21 = vpaddb_avx2(auVar21,auVar25);
                *(undefined1 (*) [32])out = auVar21;
                pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x18);
                out = (char *)((long)out + 0x20);
                break;
              }
              lVar15 = -2;
              lVar7 = 0x40;
              lVar18 = 0x30;
              lVar19 = 0x20;
              lVar20 = 0x18;
              pauVar9 = pauVar10;
              pauVar12 = (undefined1 (*) [32])out;
            }
            else {
              auVar29 = vpshufb_avx2(*pauVar10,auVar21);
              auVar28 = vpand_avx2(auVar29,auVar25);
              auVar2 = vpmulhuw_avx2(auVar28,auVar26);
              auVar28 = vpand_avx2(auVar29,auVar27);
              auVar29 = vpsllw_avx2(auVar28,8);
              auVar28 = vpsllw_avx2(auVar28,4);
              auVar28 = vpblendw_avx2(auVar28,auVar29,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar28);
              auVar29 = vpsubusb_avx2(auVar2,auVar22);
              auVar28 = vpcmpgtb_avx2(auVar2,auVar23);
              auVar28 = vpsubb_avx2(auVar29,auVar28);
              auVar28 = vpshufb_avx2(auVar24,auVar28);
              auVar28 = vpaddb_avx2(auVar28,auVar2);
              *(undefined1 (*) [32])out = auVar28;
              auVar29 = vpshufb_avx2(*(undefined1 (*) [32])(*pauVar10 + 0x18),auVar21);
              auVar28 = vpand_avx2(auVar29,auVar25);
              auVar2 = vpmulhuw_avx2(auVar28,auVar26);
              auVar28 = vpand_avx2(auVar29,auVar27);
              auVar29 = vpsllw_avx2(auVar28,8);
              auVar28 = vpsllw_avx2(auVar28,4);
              auVar28 = vpblendw_avx2(auVar28,auVar29,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar28);
              auVar29 = vpsubusb_avx2(auVar2,auVar22);
              auVar28 = vpcmpgtb_avx2(auVar2,auVar23);
              auVar28 = vpsubb_avx2(auVar29,auVar28);
              auVar28 = vpshufb_avx2(auVar24,auVar28);
              auVar28 = vpaddb_avx2(auVar28,auVar2);
              *(undefined1 (*) [32])((long)out + 0x20) = auVar28;
              auVar29 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar10[1] + 0x10),auVar21);
              auVar28 = vpand_avx2(auVar29,auVar25);
              auVar2 = vpmulhuw_avx2(auVar28,auVar26);
              auVar28 = vpand_avx2(auVar29,auVar27);
              auVar29 = vpsllw_avx2(auVar28,8);
              auVar28 = vpsllw_avx2(auVar28,4);
              auVar28 = vpblendw_avx2(auVar28,auVar29,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar28);
              auVar29 = vpsubusb_avx2(auVar2,auVar22);
              auVar28 = vpcmpgtb_avx2(auVar2,auVar23);
              auVar28 = vpsubb_avx2(auVar29,auVar28);
              auVar28 = vpshufb_avx2(auVar24,auVar28);
              auVar28 = vpaddb_avx2(auVar28,auVar2);
              *(undefined1 (*) [32])((long)out + 0x40) = auVar28;
              auVar29 = vpshufb_avx2(*(undefined1 (*) [32])(pauVar10[2] + 8),auVar21);
              auVar28 = vpand_avx2(auVar29,auVar25);
              auVar2 = vpmulhuw_avx2(auVar28,auVar26);
              auVar28 = vpand_avx2(auVar29,auVar27);
              auVar29 = vpsllw_avx2(auVar28,8);
              auVar28 = vpsllw_avx2(auVar28,4);
              auVar28 = vpblendw_avx2(auVar28,auVar29,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar28);
              auVar29 = vpsubusb_avx2(auVar2,auVar22);
              auVar28 = vpcmpgtb_avx2(auVar2,auVar23);
              auVar28 = vpsubb_avx2(auVar29,auVar28);
              auVar28 = vpshufb_avx2(auVar24,auVar28);
              auVar28 = vpaddb_avx2(auVar28,auVar2);
              *(undefined1 (*) [32])((long)out + 0x60) = auVar28;
              lVar15 = -8;
              lVar7 = 0x100;
              lVar19 = 0xe0;
              lVar20 = 0xa8;
              lVar17 = 0xc0;
              lVar8 = 0x90;
              lVar4 = 0xa0;
              lVar11 = 0x78;
              lVar18 = 0xc0;
              pauVar9 = (undefined1 (*) [32])((long)out + 0x80);
              pauVar12 = pauVar10 + 3;
LAB_0010716b:
              auVar29 = vpshufb_avx2(*pauVar12,auVar21);
              auVar28 = vpand_avx2(auVar29,auVar25);
              auVar2 = vpmulhuw_avx2(auVar28,auVar26);
              auVar28 = vpand_avx2(auVar29,auVar27);
              auVar29 = vpsllw_avx2(auVar28,8);
              auVar28 = vpsllw_avx2(auVar28,4);
              auVar28 = vpblendw_avx2(auVar28,auVar29,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar28);
              auVar29 = vpsubusb_avx2(auVar2,auVar22);
              auVar28 = vpcmpgtb_avx2(auVar2,auVar23);
              auVar28 = vpsubb_avx2(auVar29,auVar28);
              auVar28 = vpshufb_avx2(auVar24,auVar28);
              auVar28 = vpaddb_avx2(auVar28,auVar2);
              *pauVar9 = auVar28;
              auVar29 = vpshufb_avx2(*(undefined1 (*) [32])(*pauVar10 + lVar11),auVar21);
              auVar28 = vpand_avx2(auVar29,auVar25);
              auVar2 = vpmulhuw_avx2(auVar28,auVar26);
              auVar28 = vpand_avx2(auVar29,auVar27);
              auVar29 = vpsllw_avx2(auVar28,8);
              auVar28 = vpsllw_avx2(auVar28,4);
              auVar28 = vpblendw_avx2(auVar28,auVar29,0xaa);
              auVar2 = vpor_avx2(auVar2,auVar28);
              auVar29 = vpsubusb_avx2(auVar2,auVar22);
              auVar28 = vpcmpgtb_avx2(auVar2,auVar23);
              auVar28 = vpsubb_avx2(auVar29,auVar28);
              auVar28 = vpshufb_avx2(auVar24,auVar28);
              auVar28 = vpaddb_avx2(auVar28,auVar2);
              *(undefined1 (*) [32])(*(undefined1 (*) [32])out + lVar4) = auVar28;
              pauVar9 = (undefined1 (*) [32])(*pauVar10 + lVar8);
              pauVar12 = (undefined1 (*) [32])(*(undefined1 (*) [32])out + lVar17);
            }
            auVar29 = vpshufb_avx2(*pauVar9,auVar21);
            auVar28 = vpand_avx2(auVar29,auVar25);
            auVar2 = vpmulhuw_avx2(auVar28,auVar26);
            auVar28 = vpand_avx2(auVar29,auVar27);
            auVar29 = vpsllw_avx2(auVar28,8);
            auVar28 = vpsllw_avx2(auVar28,4);
            auVar28 = vpblendw_avx2(auVar28,auVar29,0xaa);
            auVar2 = vpor_avx2(auVar2,auVar28);
            auVar29 = vpsubusb_avx2(auVar2,auVar22);
            auVar28 = vpcmpgtb_avx2(auVar2,auVar23);
            auVar28 = vpsubb_avx2(auVar29,auVar28);
            auVar28 = vpshufb_avx2(auVar24,auVar28);
            auVar28 = vpaddb_avx2(auVar28,auVar2);
            *pauVar12 = auVar28;
            auVar29 = vpshufb_avx2(*(undefined1 (*) [32])(*pauVar10 + lVar20),auVar21);
            auVar28 = vpand_avx2(auVar29,auVar25);
            auVar2 = vpmulhuw_avx2(auVar28,auVar26);
            auVar28 = vpand_avx2(auVar29,auVar27);
            auVar29 = vpsllw_avx2(auVar28,8);
            auVar28 = vpsllw_avx2(auVar28,4);
            auVar28 = vpblendw_avx2(auVar28,auVar29,0xaa);
            auVar2 = vpor_avx2(auVar2,auVar28);
            auVar29 = vpsubusb_avx2(auVar2,auVar22);
            auVar28 = vpcmpgtb_avx2(auVar2,auVar23);
            auVar28 = vpsubb_avx2(auVar29,auVar28);
            auVar28 = vpshufb_avx2(auVar24,auVar28);
            auVar28 = vpaddb_avx2(auVar28,auVar2);
            *(undefined1 (*) [32])(*(undefined1 (*) [32])out + lVar19) = auVar28;
            pauVar10 = (undefined1 (*) [32])(*pauVar10 + lVar18);
            out = *(undefined1 (*) [32])out + lVar7;
            uVar6 = uVar6 + lVar15;
          } while (uVar6 != 0);
        }
        src = *pauVar10 + 4;
        local_50 = uVar5 * 0x20 + sVar16;
      }
      if (srclen == 0) {
        uVar14 = 0;
        break;
      }
      srclen = srclen - 1;
      (*(undefined1 (*) [32])out)[0] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(byte)(*(undefined1 (*) [32])src)[0] >> 2];
      out = *(undefined1 (*) [32])out + 1;
      puVar3 = *(undefined1 (*) [32])src;
      src = *(undefined1 (*) [32])src + 1;
      bVar13 = (*puVar3 & 3) << 4;
      local_50 = local_50 + 1;
LAB_00107366:
      if (srclen == 0) {
        uVar14 = 1;
        break;
      }
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar13 | (byte)*src >> 4)];
      out = (char *)((uint8_t *)out + 1);
      bVar13 = *src;
      src = (char *)((byte *)src + 1);
      bVar13 = (bVar13 & 0xf) << 2;
      local_50 = local_50 + 1;
LAB_001073a7:
      if (srclen == 0) goto LAB_001073ef;
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar13 | (byte)*src >> 6)];
      bVar1 = *src;
      src = (char *)((byte *)src + 1);
      ((uint8_t *)out)[1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
      out = (char *)((uint8_t *)out + 2);
      sVar16 = local_50 + 2;
    } while( true );
  }
LAB_00107402:
  state->bytes = uVar14;
  state->carry = bVar13;
  *outlen = local_50;
  return;
LAB_001073ef:
  uVar14 = 2;
  goto LAB_00107402;
}

Assistant:

BASE64_ENC_FUNCTION(avx2)
{
#if HAVE_AVX2
	#include "../generic/enc_head.c"
	enc_loop_avx2(&s, &slen, &o, &olen);
	#include "../generic/enc_tail.c"
#else
	BASE64_ENC_STUB
#endif
}